

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O0

void init_for_bitblt(void)

{
  if (for_makeinit == 0) {
    BITBLTBITMAP_index = get_package_atom("\\PUNT.BITBLT.BITMAP",0x13,"INTERLISP",9,0);
    BLTSHADEBITMAP_index = get_package_atom("\\PUNT.BLTSHADE.BITMAP",0x15,"INTERLISP",9,0);
  }
  return;
}

Assistant:

void init_for_bitblt(void) {
#ifdef COLOR
  extern LispPTR *COLORSCREEN68k;
#endif /* COLOR */

  if (!for_makeinit) {
    BITBLTBITMAP_index = get_package_atom("\\PUNT.BITBLT.BITMAP", 19, "INTERLISP", 9, NIL);
    BLTSHADEBITMAP_index = get_package_atom("\\PUNT.BLTSHADE.BITMAP", 21, "INTERLISP", 9, NIL);

#ifdef COLOR
    COLORSCREEN_index = MAKEATOM("\\COLORSCREEN");
    COLORSCREEN68k = GetVALCELL68k(COLORSCREEN_index);
#endif /* COLOR */
  }
}